

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

Id dxil_spv::emit_atomic_access_chain
             (Impl *impl,ResourceMeta *meta,RawWidth width,Id image_id,Id coord,
             ComponentType *component_type)

{
  undefined8 uVar1;
  ComponentType CVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  int width_00;
  PhysicalPointerMeta *pPVar5;
  PhysicalPointerMeta local_60;
  initializer_list<unsigned_int> local_50;
  PhysicalPointerMeta local_3c;
  
  this = Converter::Impl::builder(impl);
  CVar2 = U32;
  if (width < Count) {
    CVar2 = (ComponentType)(0x70503ff >> ((char)width * '\b' & 0x1fU));
  }
  *component_type = CVar2;
  IVar3 = get_buffer_alias_handle(impl,meta,meta->var_id,Integer,width,V1);
  if (meta->storage == StorageClassStorageBuffer) {
    width_00 = 0x20;
    if (width < Count) {
      width_00 = *(int *)(&DAT_001c2c20 + (ulong)width * 4);
    }
    IVar4 = spv::Builder::makeIntegerType(this,width_00,false);
    IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar4);
    this_01 = Converter::Impl::allocate(impl,OpAccessChain,IVar4);
    pPVar5 = &local_60;
    local_60._0_4_ = IVar3;
    IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar3 = spv::Builder::makeIntConstant(this,IVar3,0,false);
    local_60._4_4_ = IVar3;
    local_60.size = coord;
  }
  else {
    if (meta->storage != StorageClassPhysicalStorageBuffer) {
      IVar4 = Converter::Impl::get_type_id(impl,meta->component_type,1,1,false);
      IVar4 = spv::Builder::makePointer(this,StorageClassImage,IVar4);
      this_01 = Converter::Impl::allocate(impl,OpImageTexelPointer,IVar4);
      local_60._4_4_ = coord;
      local_60._0_4_ = IVar3;
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      local_60.size = spv::Builder::makeIntConstant(this,IVar3,0,false);
      local_50._M_len = 3;
      local_50._M_array = (iterator)&local_60;
      Operation::add_ids(this_01,&local_50);
      *component_type = meta->component_type;
      goto LAB_001762dd;
    }
    if (width == B8) {
      IVar3 = spv::Builder::makeIntegerType(this,8,false);
      local_60.stride = '\x01';
    }
    else if (width == B64) {
      IVar3 = spv::Builder::makeIntegerType(this,0x40,false);
      local_60.stride = '\b';
    }
    else if (width == B16) {
      IVar3 = spv::Builder::makeIntegerType(this,0x10,false);
      local_60.stride = '\x02';
    }
    else {
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      local_60.stride = '\x04';
    }
    uVar1._0_1_ = (meta->physical_pointer_meta).nonwritable;
    uVar1._1_1_ = (meta->physical_pointer_meta).nonreadable;
    uVar1._2_1_ = (meta->physical_pointer_meta).coherent;
    uVar1._3_1_ = (meta->physical_pointer_meta).rov;
    uVar1._4_1_ = (meta->physical_pointer_meta).stride;
    uVar1._5_3_ = *(undefined3 *)&(meta->physical_pointer_meta).field_0x5;
    local_60.size = (meta->physical_pointer_meta).size;
    local_60._0_4_ = SUB84(uVar1,0);
    local_60._5_3_ = uVar1._5_3_;
    IVar4 = Converter::Impl::get_physical_pointer_block_type(impl,IVar3,&local_60);
    this_00 = Converter::Impl::allocate(impl,OpBitcast,IVar4);
    Operation::add_id(this_00,image_id);
    Converter::Impl::add(impl,this_00,false);
    IVar3 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar3);
    this_01 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
    local_3c._0_4_ = this_00->id;
    pPVar5 = &local_3c;
    IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
    local_3c._4_4_ = spv::Builder::makeIntConstant(this,IVar3,0,false);
    local_3c.size = coord;
  }
  local_50._M_len = 3;
  local_50._M_array = (iterator)pPVar5;
  Operation::add_ids(this_01,&local_50);
LAB_001762dd:
  Converter::Impl::add(impl,this_01,false);
  return this_01->id;
}

Assistant:

spv::Id emit_atomic_access_chain(Converter::Impl &impl,
                                 const Converter::Impl::ResourceMeta &meta,
                                 RawWidth width, spv::Id image_id, spv::Id coord,
                                 DXIL::ComponentType &component_type)
{
	auto &builder = impl.builder();
	Operation *counter_ptr_op = nullptr;
	component_type = raw_width_to_component_type(RawType::Integer, width);
	spv::Id var_id = get_buffer_alias_handle(impl, meta, meta.var_id, RawType::Integer, width, RawVecSize::V1);
	if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		spv::Id uint_type = builder.makeUintType(raw_width_to_bits(width));
		auto physical_pointer_meta = meta.physical_pointer_meta;
		physical_pointer_meta.stride = raw_width_to_bits(width) / 8;
		spv::Id ptr_type_id =
		    impl.get_physical_pointer_block_type(uint_type, physical_pointer_meta);

		auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
		ptr_bitcast_op->add_id(image_id);
		impl.add(ptr_bitcast_op);

		counter_ptr_op = impl.allocate(spv::OpAccessChain,
		                               builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type));
		counter_ptr_op->add_ids({ ptr_bitcast_op->id, builder.makeUintConstant(0), coord });
	}
	else if (meta.storage == spv::StorageClassStorageBuffer)
	{
		counter_ptr_op =
		    impl.allocate(spv::OpAccessChain,
		                  builder.makePointer(spv::StorageClassStorageBuffer,
		                                      builder.makeUintType(raw_width_to_bits(width))));
		counter_ptr_op->add_ids({ var_id, builder.makeUintConstant(0), coord });
	}
	else
	{
		counter_ptr_op =
		    impl.allocate(spv::OpImageTexelPointer,
		                  builder.makePointer(spv::StorageClassImage, impl.get_type_id(meta.component_type, 1, 1)));
		counter_ptr_op->add_ids({ var_id, coord, builder.makeUintConstant(0) });
		component_type = meta.component_type;
	}
	impl.add(counter_ptr_op);

	return counter_ptr_op->id;
}